

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O0

int blake2b_compress(hash_state *md,uchar *buf)

{
  long in_RSI;
  long in_RDI;
  unsigned_long i;
  ulong64 v [16];
  ulong64 m [16];
  ulong local_120;
  ulong local_118 [8];
  ulong local_d8;
  ulong64 local_d0;
  ulong64 local_c8;
  ulong64 local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  long alStack_98 [18];
  long local_8;
  
  for (local_120 = 0; local_120 < 0x10; local_120 = local_120 + 1) {
    alStack_98[local_120] = *(long *)(in_RSI + local_120 * 8);
  }
  for (local_120 = 0; local_120 < 8; local_120 = local_120 + 1) {
    local_118[local_120] = *(ulong *)(in_RDI + local_120 * 8);
  }
  local_d8 = 0x6a09e667f3bcc908;
  local_d0 = 0xbb67ae8584caa73b;
  local_c8 = 0x3c6ef372fe94f82b;
  local_c0 = 0xa54ff53a5f1d36f1;
  local_b8 = *(ulong *)(in_RDI + 0x40) ^ 0x510e527fade682d1;
  local_b0 = *(ulong *)(in_RDI + 0x48) ^ 0x9b05688c2b3e6c1f;
  local_a8 = *(ulong *)(in_RDI + 0x50) ^ 0x1f83d9abfb41bd6b;
  local_a0 = *(ulong *)(in_RDI + 0x58) ^ 0x5be0cd19137e2179;
  local_118[0] = local_118[0] + local_118[4] + alStack_98[0];
  local_8 = in_RDI;
  local_b8 = ROR64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[1];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[2];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[3];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[4];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[5];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[6];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[7];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[8];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[9];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[10];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[0xb];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[0xc];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[0xd];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[0xe];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[0xf];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[0xe];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[10];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[4];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[8];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[9];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[0xf];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[0xd];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[6];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[1];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[0xc];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[0];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[2];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[0xb];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[7];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[5];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[3];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[0xb];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[8];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[0xc];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[0];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[5];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[2];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[0xf];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[0xd];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[10];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[0xe];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[3];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[6];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[7];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[1];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[9];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[4];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[7];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[9];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[3];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[1];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[0xd];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[0xc];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[0xb];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[0xe];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[2];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[6];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[5];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[10];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[4];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[0];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[0xf];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[8];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[9];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[0];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[5];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[7];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[2];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[4];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[10];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[0xf];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[0xe];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[1];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[0xb];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[0xc];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[6];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[8];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[3];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[0xd];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[2];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[0xc];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[6];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[10];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[0];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[0xb];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[8];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[3];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[4];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[0xd];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[7];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[5];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[0xf];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[0xe];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[1];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[9];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[0xc];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[5];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[1];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[0xf];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[0xe];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[0xd];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[4];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[10];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[0];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[7];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[6];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[3];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[9];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[2];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[8];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[0xb];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[0xd];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[0xb];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[7];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[0xe];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[0xc];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[1];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[3];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[9];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[5];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[0];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[0xf];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[4];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[8];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[6];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[2];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[10];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[6];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[0xf];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[0xe];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[9];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[0xb];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[3];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[0];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[8];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[0xc];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[2];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[0xd];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[7];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[1];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[4];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[10];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[5];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[10];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[2];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[8];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[4];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[7];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[6];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[1];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[5];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[0xf];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[0xb];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[9];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[0xe];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[3];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[0xc];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[0xd];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[0];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[0];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[1];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[2];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[3];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[4];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[5];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[6];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[7];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[8];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[9];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[10];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[0xb];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[0xc];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[0xd];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[0xe];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[0xf];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x3f);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[0xe];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x20);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x18);
  local_118[0] = local_118[0] + local_118[4] + alStack_98[10];
  local_b8 = ROR64(local_b8 ^ local_118[0],0x10);
  local_d8 = local_d8 + local_b8;
  local_118[4] = ROR64(local_118[4] ^ local_d8,0x3f);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[4];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x20);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x18);
  local_118[1] = local_118[1] + local_118[5] + alStack_98[8];
  local_b0 = ROR64(local_b0 ^ local_118[1],0x10);
  local_d0 = local_d0 + local_b0;
  local_118[5] = ROR64(local_118[5] ^ local_d0,0x3f);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[9];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x20);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x18);
  local_118[2] = local_118[2] + local_118[6] + alStack_98[0xf];
  local_a8 = ROR64(local_a8 ^ local_118[2],0x10);
  local_c8 = local_c8 + local_a8;
  local_118[6] = ROR64(local_118[6] ^ local_c8,0x3f);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[0xd];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x20);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x18);
  local_118[3] = local_118[3] + local_118[7] + alStack_98[6];
  local_a0 = ROR64(local_a0 ^ local_118[3],0x10);
  local_c0 = local_c0 + local_a0;
  local_118[7] = ROR64(local_118[7] ^ local_c0,0x3f);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[1];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x20);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x18);
  local_118[0] = local_118[0] + local_118[5] + alStack_98[0xc];
  local_a0 = ROR64(local_a0 ^ local_118[0],0x10);
  local_c8 = local_c8 + local_a0;
  local_118[5] = ROR64(local_118[5] ^ local_c8,0x3f);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[0];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x20);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x18);
  local_118[1] = local_118[1] + local_118[6] + alStack_98[2];
  local_b8 = ROR64(local_b8 ^ local_118[1],0x10);
  local_c0 = local_c0 + local_b8;
  local_118[6] = ROR64(local_118[6] ^ local_c0,0x3f);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[0xb];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x20);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x18);
  local_118[2] = local_118[2] + local_118[7] + alStack_98[7];
  local_b0 = ROR64(local_b0 ^ local_118[2],0x10);
  local_d8 = local_d8 + local_b0;
  local_118[7] = ROR64(local_118[7] ^ local_d8,0x3f);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[5];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x20);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x18);
  local_118[3] = local_118[3] + local_118[4] + alStack_98[3];
  local_a8 = ROR64(local_a8 ^ local_118[3],0x10);
  local_d0 = local_d0 + local_a8;
  local_118[4] = ROR64(local_118[4] ^ local_d0,0x3f);
  for (local_120 = 0; local_120 < 8; local_120 = local_120 + 1) {
    *(ulong *)(local_8 + local_120 * 8) =
         *(ulong *)(local_8 + local_120 * 8) ^ local_118[local_120] ^ (&local_d8)[local_120];
  }
  return 0;
}

Assistant:

static int blake2b_compress(hash_state *md, const unsigned char *buf)
#endif
{
   ulong64 m[16];
   ulong64 v[16];
   unsigned long i;

   for (i = 0; i < 16; ++i) {
      LOAD64L(m[i], buf + i * sizeof(m[i]));
   }

   for (i = 0; i < 8; ++i) {
      v[i] = md->blake2b.h[i];
   }

   v[8] = blake2b_IV[0];
   v[9] = blake2b_IV[1];
   v[10] = blake2b_IV[2];
   v[11] = blake2b_IV[3];
   v[12] = blake2b_IV[4] ^ md->blake2b.t[0];
   v[13] = blake2b_IV[5] ^ md->blake2b.t[1];
   v[14] = blake2b_IV[6] ^ md->blake2b.f[0];
   v[15] = blake2b_IV[7] ^ md->blake2b.f[1];

   ROUND(0);
   ROUND(1);
   ROUND(2);
   ROUND(3);
   ROUND(4);
   ROUND(5);
   ROUND(6);
   ROUND(7);
   ROUND(8);
   ROUND(9);
   ROUND(10);
   ROUND(11);

   for (i = 0; i < 8; ++i) {
      md->blake2b.h[i] = md->blake2b.h[i] ^ v[i] ^ v[i + 8];
   }
   return CRYPT_OK;
}